

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::teximage2d(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_ENUM is generated if target is invalid.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0,0,0x1908,1,1,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x500);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"GL_INVALID_ENUM is generated if type is not a type constant.",
             &local_69);
  NegativeTestContext::beginSection(pNVar1,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0xde1,0,0x1908,1,1,0,0x1908,0,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x500);
  NegativeTestContext::endSection(local_10);
  pNVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,
             "GL_INVALID_OPERATION is generated if the combination of internalFormat, format and type is invalid."
             ,&local_91);
  NegativeTestContext::beginSection(pNVar1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0xde1,0,0x1907,1,1,0,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x502);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0xde1,0,0x1908,1,1,0,0x1907,0x8033,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x502);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0xde1,0,0x8057,1,1,0,0x1907,0x8034,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x502);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0xde1,0,0x8059,1,1,0,0x1907,0x8368,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x502);
  glu::CallLogWrapper::glTexImage2D
            (&local_10->super_CallLogWrapper,0xde1,0,0x8d70,1,1,0,0x8d99,0x1404,(void *)0x0);
  NegativeTestContext::expectError(local_10,0x502);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void teximage2d (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if target is invalid.");
	ctx.glTexImage2D(0, 0, GL_RGBA, 1, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_ENUM is generated if type is not a type constant.");
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, 1, 1, 0, GL_RGBA, 0, 0);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION is generated if the combination of internalFormat, format and type is invalid.");
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, 1, 1, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, 1, 1, 0, GL_RGB, GL_UNSIGNED_SHORT_4_4_4_4, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB5_A1, 1, 1, 0, GL_RGB, GL_UNSIGNED_SHORT_5_5_5_1, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB10_A2, 1, 1, 0, GL_RGB, GL_UNSIGNED_INT_2_10_10_10_REV, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32UI, 1, 1, 0, GL_RGBA_INTEGER, GL_INT, 0);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();
}